

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x83;
  uint64_t x82;
  uint64_t x81;
  uint64_t x80;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x79;
  uint64_t x78;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x77;
  uint64_t x76;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x75;
  uint64_t x74;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x73;
  uint64_t x72;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x71;
  uint64_t x70;
  uint64_t x69;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x68;
  uint64_t x67;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x66;
  uint64_t x65;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x64;
  uint64_t x63;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x62;
  uint64_t x61;
  uint64_t x60;
  uint64_t x59;
  uint64_t x58;
  uint64_t x57;
  uint64_t x56;
  uint64_t x55;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x54;
  uint64_t x53;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x52;
  uint64_t x51;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x46;
  uint64_t x45;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x44;
  uint64_t x43;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x42;
  uint64_t x41;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  uint64_t x35;
  uint64_t x34;
  uint64_t x33;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x32;
  uint64_t x31;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x30;
  uint64_t x29;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x28;
  uint64_t x27;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  uint64_t x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x14;
  uint64_t x13;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  uint64_t in_stack_fffffffffffffd78;
  uint64_t in_stack_fffffffffffffd80;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 in_stack_fffffffffffffd8f;
  uint64_t *in_stack_fffffffffffffd90;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_261;
  uint64_t local_260;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_251;
  uint64_t local_250;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_241;
  uint64_t local_240;
  uint64_t local_238;
  byte local_229;
  uint64_t local_228;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_219;
  uint64_t local_218;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_209;
  uint64_t local_208;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_1f9;
  uint64_t local_1f8;
  uint64_t local_1f0;
  uint64_t local_1e8;
  uint64_t local_1e0;
  uint64_t local_1d8;
  uint64_t local_1d0;
  uint64_t local_1c8;
  byte local_1b9;
  uint64_t local_1b8;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_1a9;
  uint64_t local_1a8;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_199;
  uint64_t local_198;
  uint64_t local_190;
  uint64_t local_188;
  byte local_179;
  uint64_t local_178;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_169;
  uint64_t local_168;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_159;
  uint64_t local_158;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_149;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  uint64_t local_130;
  uint64_t local_128;
  uint64_t local_120;
  uint64_t local_118;
  byte local_109;
  uint64_t local_108;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_f9;
  uint64_t local_f8;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 local_e9;
  uint64_t local_e8;
  byte local_d9;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  byte local_b9;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  byte local_79;
  uint64_t local_78;
  byte local_69;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_18,&local_20,*in_RSI,0x27acdc4);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_28,&local_30,local_18,0xbd667ab8a3347857);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_38,&local_40,local_28,0x8000000000000000);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_48,&local_50,local_28,0xc99);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_58,&local_60,local_10[1],0x27acdc4);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_68,&local_69,'\0',local_18,local_48);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_78,&local_79,'\0',local_69 + local_20 + local_50,local_58);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_88,&local_90,local_78,0xbd667ab8a3347857);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_98,&local_a0,local_88,0x8000000000000000);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_a8,&local_b0,local_88,0xc99);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_b8,&local_b9,'\0',local_40,local_98);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_c8,&local_d0,local_10[2],0x27acdc4);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_d8,&local_d9,'\0',local_78,local_a8);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_e8,&local_e9,'\0',(ulong)local_d9 + local_79 + local_60 + local_b0,local_c8);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_f8,&local_f9,local_e9,local_38,local_d0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_108,&local_109,local_f9,local_b8,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_118,&local_120,local_e8,0xbd667ab8a3347857);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_128,&local_130,local_118,0x8000000000000000);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_138,&local_140,local_118,0xc99);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_148,&local_149,'\0',local_e8,local_138);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_158,&local_159,local_149,local_f8,local_140);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_168,&local_169,local_159,local_108,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_178,&local_179,local_169,(ulong)local_109 + local_b9 + local_a0,local_128);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_188,&local_190,local_10[3],0x27acdc4);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_198,&local_199,'\0',local_158,local_188);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_1a8,&local_1a9,local_199,local_168,local_190);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_1b8,&local_1b9,local_1a9,local_178,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_1c8,&local_1d0,local_198,0xbd667ab8a3347857);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64
            (&local_1d8,&local_1e0,local_1c8,0x8000000000000000);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&local_1e8,&local_1f0,local_1c8,0xc99);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_1f8,&local_1f9,'\0',local_198,local_1e8);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_208,&local_209,local_1f9,local_1a8,local_1f0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_218,&local_219,local_209,local_1b8,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64
            (&local_228,&local_229,local_219,(ulong)local_1b9 + local_179 + local_130,local_1d8);
  local_238 = local_229 + local_1e0;
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64
            (&local_240,&local_241,'\0',local_208,0xc99);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64
            (&local_250,&local_251,local_241,local_218,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64
            (&local_260,&local_261,local_251,local_228,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffd90,&stack0xfffffffffffffd8f,local_261,local_238,
             0x8000000000000000);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffd80,&stack0xfffffffffffffd7f,in_stack_fffffffffffffd8f
             ,0,0);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8f,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  *local_8 = local_290;
  local_8[1] = local_298;
  local_8[2] = local_2a0;
  local_8[3] = local_2a8;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_to_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x26;
    uint64_t x27;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x28;
    uint64_t x29;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x30;
    uint64_t x31;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x44;
    uint64_t x45;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x50;
    uint64_t x51;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x54;
    uint64_t x55;
    uint64_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    uint64_t x61;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x68;
    uint64_t x69;
    uint64_t x70;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x71;
    uint64_t x72;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x73;
    uint64_t x74;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x75;
    uint64_t x76;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x77;
    uint64_t x78;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_uint1 x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x1, &x2, (arg1[0]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x3, &x4, x1, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x5, &x6, x3, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x7, &x8, x3,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x9, &x10, (arg1[1]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x11, &x12, 0x0,
                                                              x1, x7);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x13, &x14, 0x0, ((x12 + x2) + x8), x9);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x15, &x16, x13, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x17, &x18, x15, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x19, &x20, x15,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x21, &x22, 0x0,
                                                              x6, x17);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x23, &x24, (arg1[2]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x25, &x26, 0x0,
                                                              x13, x19);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x27, &x28, 0x0, ((x26 + (x14 + x10)) + x20), x23);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x29, &x30, x28,
                                                              x5, x24);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x31, &x32, x30,
                                                              x21, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x33, &x34, x27, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x35, &x36, x33, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x37, &x38, x33,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x39, &x40, 0x0,
                                                              x27, x37);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x29, x38);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x43, &x44, x42,
                                                              x31, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x45, &x46, x44, (x32 + (x22 + x18)), x35);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x47, &x48, (arg1[3]),
                                                         UINT32_C(0x27acdc4));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x49, &x50, 0x0,
                                                              x41, x47);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x51, &x52, x50,
                                                              x43, x48);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x53, &x54, x52,
                                                              x45, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x55, &x56, x49, UINT64_C(0xbd667ab8a3347857));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(
        &x57, &x58, x55, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mulx_u64(&x59, &x60, x55,
                                                         UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x61, &x62, 0x0,
                                                              x49, x59);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x63, &x64, x62,
                                                              x51, x60);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(&x65, &x66, x64,
                                                              x53, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_addcarryx_u64(
        &x67, &x68, x66, (x54 + (x46 + x36)), x57);
    x69 = (x68 + x58);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x70, &x71, 0x0, x63, UINT16_C(0xc99));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x72, &x73, x71,
                                                               x65, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x74, &x75, x73,
                                                               x67, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(
        &x76, &x77, x75, x69, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_subborrowx_u64(&x78, &x79, x77,
                                                               0x0, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x80, x79, x70,
                                                            x63);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x81, x79, x72,
                                                            x65);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x82, x79, x74,
                                                            x67);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_cmovznz_u64(&x83, x79, x76,
                                                            x69);
    out1[0] = x80;
    out1[1] = x81;
    out1[2] = x82;
    out1[3] = x83;
}